

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O0

bool leveldb::GetLevel(Slice *input,int *level)

{
  bool bVar1;
  uint *in_RSI;
  uint32_t *unaff_retaddr;
  Slice *in_stack_00000008;
  uint32_t v;
  uint local_1c;
  bool local_1;
  
  bVar1 = GetVarint32(in_stack_00000008,unaff_retaddr);
  if ((bVar1) && (local_1c < 7)) {
    *in_RSI = local_1c;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool GetLevel(Slice* input, int* level) {
  uint32_t v;
  if (GetVarint32(input, &v) && v < config::kNumLevels) {
    *level = v;
    return true;
  } else {
    return false;
  }
}